

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::VertexAttributeCase::iterate(VertexAttributeCase *this)

{
  allocator<tcu::Vector<unsigned_int,_4>_> *this_00;
  allocator<unsigned_short> *this_01;
  code *pcVar1;
  short sVar2;
  short sVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  TestLog *this_02;
  MessageBuilder *this_03;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  size_type sVar12;
  PixelBufferAccess local_298;
  undefined4 local_270;
  undefined4 local_26c;
  GLint attribLoc;
  GLint positionLoc;
  Functions *gl;
  int local_e0;
  int local_dc;
  int baseNdx;
  int y_1;
  int x_1;
  uint local_cc [2];
  Vector<float,_4> local_c4;
  float local_b4;
  float local_b0;
  float posY;
  float posX;
  deUint32 one;
  int y;
  int x;
  Surface resultImage;
  undefined1 local_80 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  undefined1 local_60 [8];
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
  gridAttributes;
  allocator<tcu::Vector<float,_4>_> local_31;
  undefined1 local_30 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridVertices;
  VertexAttributeCase *this_local;
  
  gridVertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_31);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30,
             0x1e4,&local_31);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_31);
  this_00 = (allocator<tcu::Vector<unsigned_int,_4>_> *)
            ((long)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<unsigned_int,_4>_>::allocator(this_00);
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::vector
            ((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )local_60,0x1e4,this_00);
  std::allocator<tcu::Vector<unsigned_int,_4>_>::~allocator
            ((allocator<tcu::Vector<unsigned_int,_4>_> *)
             ((long)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  this_01 = (allocator<unsigned_short> *)((long)&resultImage.m_pixels.m_cap + 7);
  std::allocator<unsigned_short>::allocator(this_01);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,0xa56,this_01);
  std::allocator<unsigned_short>::~allocator
            ((allocator<unsigned_short> *)((long)&resultImage.m_pixels.m_cap + 7));
  tcu::Surface::Surface((Surface *)&y,0x100,0x100);
  for (one = 0; (int)one < 0x16; one = one + 1) {
    for (posX = 0.0; (int)posX < 0x16; posX = (float)((int)posX + 1)) {
      posY = 1.0;
      local_b0 = (float)(int)one / 21.0 + (float)(int)one / 21.0 + -1.0;
      local_b4 = (float)(int)posX / 21.0 + (float)(int)posX / 21.0 + -1.0;
      tcu::Vector<float,_4>::Vector(&local_c4,local_b0,local_b4,0.0,1.0);
      pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_30,(long)(int)(one * 0x16 + (int)posX));
      *(undefined8 *)pvVar8->m_data = local_c4.m_data._0_8_;
      *(undefined8 *)(pvVar8->m_data + 2) = local_c4.m_data._8_8_;
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)&y_1,
                 *(uint *)(Stress::(anonymous_namespace)::s_specialFloats + (long)(int)one * 4),
                 *(uint *)(Stress::(anonymous_namespace)::s_specialFloats + (long)(int)posX * 4),
                 0x3f800000,0x3f800000);
      pvVar9 = std::
               vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)local_60,(long)(int)(one * 0x16 + (int)posX));
      *(undefined8 *)pvVar9->m_data = _y_1;
      *(uint (*) [2])(pvVar9->m_data + 2) = local_cc;
    }
  }
  for (baseNdx = 0; baseNdx < 0x15; baseNdx = baseNdx + 1) {
    for (local_dc = 0; local_dc < 0x15; local_dc = local_dc + 1) {
      local_e0 = (baseNdx * 0x15 + local_dc) * 6;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_dc;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,
                           (long)local_e0);
      *pvVar10 = sVar3 * 0x16 + sVar2;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_dc;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,
                           (long)(local_e0 + 1));
      *pvVar10 = (sVar3 + 1) * 0x16 + sVar2 + 1;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_dc;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,
                           (long)(local_e0 + 2));
      *pvVar10 = (sVar3 + 1) * 0x16 + sVar2;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_dc;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,
                           (long)(local_e0 + 3));
      *pvVar10 = sVar3 * 0x16 + sVar2;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_dc;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,
                           (long)(local_e0 + 4));
      *pvVar10 = (sVar3 + 1) * 0x16 + sVar2 + 1;
      sVar2 = (short)baseNdx;
      sVar3 = (short)local_dc;
      pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,
                           (long)(local_e0 + 5));
      *pvVar10 = sVar2 * 0x16 + sVar3 + 1;
    }
  }
  this_02 = tcu::TestContext::getLog
                      ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&gl,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
  this_03 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&gl,
                       (char (*) [92])
                       "Drawing a grid with the shader. Setting a_attr for each vertex to (special, special, 1, 1)."
                      );
  tcu::MessageBuilder::operator<<(this_03,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&gl);
  pRVar11 = gles3::Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  iVar6 = (*pRVar11->_vptr_RenderContext[3])();
  _attribLoc = CONCAT44(extraout_var,iVar6);
  pcVar1 = *(code **)(_attribLoc + 0x780);
  dVar7 = glu::ShaderProgram::getProgram((this->super_RenderCase).m_program);
  local_26c = (*pcVar1)(dVar7,"a_pos");
  pcVar1 = *(code **)(_attribLoc + 0x780);
  dVar7 = glu::ShaderProgram::getProgram((this->super_RenderCase).m_program);
  local_270 = (*pcVar1)(dVar7,"a_attr");
  if (*(int *)&(this->super_RenderCase).field_0x84 == 0) {
    (**(code **)(_attribLoc + 0x40))(0x8892,this->m_positionVboID);
    pcVar1 = *(code **)(_attribLoc + 0x150);
    sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_30);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_30,0);
    (*pcVar1)(0x8892,sVar12 << 4,pvVar8,0x88e4);
    dVar7 = (**(code **)(_attribLoc + 0x800))();
    glu::checkError(dVar7,"VertexAttributeCase::iterate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x294);
    (**(code **)(_attribLoc + 0x40))(0x8892,this->m_attribVboID);
    pcVar1 = *(code **)(_attribLoc + 0x150);
    sVar12 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             size((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                   *)local_60);
    pvVar9 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)local_60,0);
    (*pcVar1)(0x8892,sVar12 << 4,pvVar9,0x88e4);
    dVar7 = (**(code **)(_attribLoc + 0x800))();
    glu::checkError(dVar7,"VertexAttributeCase::iterate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x298);
    (**(code **)(_attribLoc + 0x40))(0x8893,this->m_elementVboID);
    pcVar1 = *(code **)(_attribLoc + 0x150);
    sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80);
    pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,0);
    (*pcVar1)(0x8893,sVar12 * 2,pvVar10,0x88e4);
    dVar7 = (**(code **)(_attribLoc + 0x800))();
    glu::checkError(dVar7,"VertexAttributeCase::iterate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x29c);
  }
  (**(code **)(_attribLoc + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(_attribLoc + 0x188))(0x4000);
  (**(code **)(_attribLoc + 0x1a00))(0,0,0x100);
  pcVar1 = *(code **)(_attribLoc + 0x1680);
  dVar7 = glu::ShaderProgram::getProgram((this->super_RenderCase).m_program);
  (*pcVar1)(dVar7);
  uVar4 = local_26c;
  if (*(int *)&(this->super_RenderCase).field_0x84 == 0) {
    (**(code **)(_attribLoc + 0x40))(0x8892,this->m_positionVboID);
    (**(code **)(_attribLoc + 0x19f0))(local_26c,4,0x1406,0,0,0);
    (**(code **)(_attribLoc + 0x40))(0x8892,this->m_attribVboID);
    (**(code **)(_attribLoc + 0x19f0))(local_270,4,0x1406,0,0,0);
    (**(code **)(_attribLoc + 0x610))(local_26c);
    (**(code **)(_attribLoc + 0x610))(local_270);
    pcVar1 = *(code **)(_attribLoc + 0x568);
    sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80);
    (*pcVar1)(4,sVar12 & 0xffffffff,0x1403,0);
    (**(code **)(_attribLoc + 0x518))(local_26c);
    (**(code **)(_attribLoc + 0x518))(local_270);
    (**(code **)(_attribLoc + 0x40))(0x8892,0);
    (**(code **)(_attribLoc + 0x40))(0x8893,0);
  }
  else if (*(int *)&(this->super_RenderCase).field_0x84 == 1) {
    pcVar1 = *(code **)(_attribLoc + 0x19f0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_30,0);
    (*pcVar1)(uVar4,4,0x1406,0,0,pvVar8);
    uVar4 = local_270;
    pcVar1 = *(code **)(_attribLoc + 0x19f0);
    pvVar9 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)local_60,0);
    (*pcVar1)(uVar4,4,0x1406,0,0,pvVar9);
    (**(code **)(_attribLoc + 0x610))(local_26c);
    (**(code **)(_attribLoc + 0x610))(local_270);
    pcVar1 = *(code **)(_attribLoc + 0x568);
    sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80);
    pvVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80,0);
    (*pcVar1)(4,sVar12 & 0xffffffff,0x1403,pvVar10);
    (**(code **)(_attribLoc + 0x518))(local_26c);
    (**(code **)(_attribLoc + 0x518))(local_270);
  }
  (**(code **)(_attribLoc + 0x1680))(0);
  (**(code **)(_attribLoc + 0x648))();
  dVar7 = (**(code **)(_attribLoc + 0x800))();
  glu::checkError(dVar7,"VertexAttributeCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x2c5);
  pRVar11 = gles3::Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  tcu::Surface::getAccess(&local_298,(Surface *)&y);
  glu::readPixels(pRVar11,0,0,&local_298);
  bVar5 = RenderCase::checkResultImage(&this->super_RenderCase,(Surface *)&y);
  if (bVar5) {
    bVar5 = RenderCase::drawTestPattern(&this->super_RenderCase,false);
    if (bVar5) {
      tcu::TestContext::setTestResult
                ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"test pattern failed");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"missing or invalid fragments");
  }
  tcu::Surface::~Surface((Surface *)&y);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_80);
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::~vector
            ((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )local_60);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30);
  return STOP;
}

Assistant:

VertexAttributeCase::IterateResult VertexAttributeCase::iterate (void)
{
	// Create a [s_specialFloats] X [s_specialFloats] grid of vertices with each vertex having 2 [s_specialFloats] values
	// and calculate some basic operations with the floating point values. If all goes well, nothing special should happen

	std::vector<tcu::Vec4>	gridVertices	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<tcu::UVec4>	gridAttributes	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<deUint16>	indices			((DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const deUint32	one		= 0x3F800000;
		const float		posX	= (float)x / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) - 1] to [-1, 1]
		const float		posY	= (float)y / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f;

		gridVertices[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
		gridAttributes[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::UVec4(s_specialFloats[x], s_specialFloats[y], one, one);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++y)
	{
		const int baseNdx = (x * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a grid with the shader. Setting a_attr for each vertex to (special, special, 1, 1)." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				attribLoc	= gl.getAttribLocation(m_program->getProgram(), "a_attr");

		if (m_storage == STORAGE_BUFFER)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_positionVboID);
			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(gridVertices.size() * sizeof(tcu::Vec4)), &gridVertices[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");

			gl.bindBuffer(GL_ARRAY_BUFFER, m_attribVboID);
			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(gridAttributes.size() * sizeof(tcu::UVec4)), &gridAttributes[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");

			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementVboID);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indices.size() * sizeof(deUint16)), &indices[0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");
		}

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		if (m_storage == STORAGE_BUFFER)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_positionVboID);
			gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);

			gl.bindBuffer(GL_ARRAY_BUFFER, m_attribVboID);
			gl.vertexAttribPointer(attribLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);

			gl.enableVertexAttribArray(positionLoc);
			gl.enableVertexAttribArray(attribLoc);
			gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, DE_NULL);
			gl.disableVertexAttribArray(positionLoc);
			gl.disableVertexAttribArray(attribLoc);

			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		else if (m_storage == STORAGE_CLIENT)
		{
			gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
			gl.vertexAttribPointer(attribLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridAttributes[0]);

			gl.enableVertexAttribArray(positionLoc);
			gl.enableVertexAttribArray(attribLoc);
			gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, &indices[0]);
			gl.disableVertexAttribArray(positionLoc);
			gl.disableVertexAttribArray(attribLoc);
		}
		else
			DE_ASSERT(false);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttributeCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing still works
	if (!drawTestPattern(false))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}